

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O3

extraction_status_t __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
::extract_demand_from_not_empty_queue
          (mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
           *this,demand_t *dest)

{
  atomic_refcounted_t *paVar1;
  invocation_type_t iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  pointer pdVar6;
  message_t *pmVar7;
  message_t *pmVar8;
  invocation_type_t __tmp_1;
  type_index __tmp;
  composed_action_name local_40;
  
  sVar3 = (this->m_queue).m_max_size;
  sVar4 = (this->m_queue).m_size;
  details::ensure_queue_not_empty<so_5::mchain_props::details::limited_preallocated_demand_queue&>
            (&this->m_queue);
  sVar5 = (this->m_queue).m_head;
  pdVar6 = (this->m_queue).m_storage.
           super__Vector_base<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pmVar7 = pdVar6[sVar5].m_message_ref.m_obj;
  pdVar6[sVar5].m_message_ref.m_obj = (message_t *)0x0;
  iVar2 = pdVar6[sVar5].m_demand_type;
  (dest->m_msg_type)._M_target = pdVar6[sVar5].m_msg_type._M_target;
  pmVar8 = (dest->m_message_ref).m_obj;
  (dest->m_message_ref).m_obj = pmVar7;
  dest->m_demand_type = iVar2;
  if (pmVar8 != (message_t *)0x0) {
    LOCK();
    paVar1 = &pmVar8->super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if ((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) {
      (*pmVar8->_vptr_message_t[1])();
    }
  }
  details::limited_preallocated_demand_queue::pop_front(&this->m_queue);
  local_40.m_1 = "service_request";
  if (dest->m_demand_type == event) {
    local_40.m_1 = "message";
  }
  local_40.m_2 = "extracted";
  impl::msg_tracing_helpers::details::
  make_trace<so_5::abstract_message_chain_t_const&,so_5::impl::msg_tracing_helpers::details::composed_action_name,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&>
            ((this->super_mchain_tracing_enabled_base).m_tracer,
             &this->super_abstract_message_chain_t,&local_40,&dest->m_msg_type,&dest->m_message_ref)
  ;
  if (sVar3 == sVar4) {
    std::condition_variable::notify_all();
  }
  return msg_extracted;
}

Assistant:

extraction_status_t
		extract_demand_from_not_empty_queue(
			demand_t & dest )
			{
				// If queue was full then someone can wait on it.
				const bool queue_was_full = m_queue.is_full();
				dest = std::move( m_queue.front() );
				m_queue.pop_front();

				this->trace_extracted_demand( *this, dest );

				if( queue_was_full )
					m_overflow_cond.notify_all();

				return extraction_status_t::msg_extracted;
			}